

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O3

void __thiscall
QAbstractItemModelTesterPrivate::dataChanged
          (QAbstractItemModelTesterPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QAbstractItemModel *pQVar1;
  QObject *pQVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QModelIndex local_60;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  if ((-1 < topLeft->r) && (bVar5 = false, -1 < topLeft->c)) {
    bVar5 = (topLeft->m).ptr != (QAbstractItemModel *)0x0;
  }
  iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar5,(uchar *)"topLeft.isValid()",0x157a73,
                 (uchar *)
                 "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                 ,0x3e4);
  if ((char)iVar3 != '\0') {
    bVar5 = false;
    if ((-1 < bottomRight->r) && (-1 < bottomRight->c)) {
      bVar5 = (bottomRight->m).ptr != (QAbstractItemModel *)0x0;
    }
    iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)bVar5,(uchar *)"bottomRight.isValid()",0x157a73,
                   (uchar *)
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3e5);
    if ((char)iVar3 != '\0') {
      local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (bottomRight->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_48 = (undefined1 *)0xffffffffffffffff;
        puStack_40 = (undefined1 *)0x0;
        local_38.ptr = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x68))(&local_48,pQVar1,bottomRight);
      }
      pQVar1 = (topLeft->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_60.r = -1;
        local_60.c = -1;
        local_60.i = 0;
        local_60.m.ptr = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x68))(&local_60,pQVar1,topLeft);
      }
      bVar5 = compare<QModelIndex,QModelIndex>
                        (this,&local_60,(QModelIndex *)&local_48,"topLeft.parent()","commonParent",
                         "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                         ,999);
      if (bVar5) {
        iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)(topLeft->r <= bottomRight->r),
                       (uchar *)"topLeft.row() <= bottomRight.row()",0x157a73,
                       (uchar *)
                       "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                       ,1000);
        if ((char)iVar3 != '\0') {
          iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)(topLeft->c <= bottomRight->c),
                         (uchar *)"topLeft.column() <= bottomRight.column()",0x157a73,
                         (uchar *)
                         "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                         ,0x3e9);
          if ((char)iVar3 != '\0') {
            pQVar2 = (this->model).wp.value;
            iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_48);
            pQVar2 = (this->model).wp.value;
            iVar4 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_48);
            iVar3 = verify(this,(EVP_PKEY_CTX *)(ulong)(bottomRight->r < iVar3),
                           (uchar *)"bottomRight.row() < rowCount",0x157a73,
                           (uchar *)
                           "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                           ,0x3ec);
            if ((char)iVar3 != '\0') {
              verify(this,(EVP_PKEY_CTX *)(ulong)(bottomRight->c < iVar4),
                     (uchar *)"bottomRight.column() < columnCount",0x157a73,
                     (uchar *)
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x3ed);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    MODELTESTER_VERIFY(topLeft.isValid());
    MODELTESTER_VERIFY(bottomRight.isValid());
    QModelIndex commonParent = bottomRight.parent();
    MODELTESTER_COMPARE(topLeft.parent(), commonParent);
    MODELTESTER_VERIFY(topLeft.row() <= bottomRight.row());
    MODELTESTER_VERIFY(topLeft.column() <= bottomRight.column());
    int rowCount = model->rowCount(commonParent);
    int columnCount = model->columnCount(commonParent);
    MODELTESTER_VERIFY(bottomRight.row() < rowCount);
    MODELTESTER_VERIFY(bottomRight.column() < columnCount);
}